

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tabs.cxx
# Opt level: O0

Fl_Widget * __thiscall Fl_Tabs::value(Fl_Tabs *this)

{
  Fl_Widget *this_00;
  Fl_Widget *pFVar1;
  uint uVar2;
  int iVar3;
  Fl_Widget **ppFVar4;
  Fl_Widget *o;
  Fl_Widget **ppFStack_20;
  int i;
  Fl_Widget **a;
  Fl_Widget *v;
  Fl_Tabs *this_local;
  
  a = (Fl_Widget **)0x0;
  ppFStack_20 = Fl_Group::array(&this->super_Fl_Group);
  o._4_4_ = Fl_Group::children(&this->super_Fl_Group);
  pFVar1 = (Fl_Widget *)a;
  while (a = (Fl_Widget **)pFVar1, iVar3 = o._4_4_ + -1, o._4_4_ != 0) {
    ppFVar4 = ppFStack_20 + 1;
    this_00 = *ppFStack_20;
    o._4_4_ = iVar3;
    ppFStack_20 = ppFVar4;
    if (a == (Fl_Widget **)0x0) {
      uVar2 = Fl_Widget::visible(this_00);
      pFVar1 = this_00;
      if ((uVar2 == 0) && (pFVar1 = (Fl_Widget *)a, iVar3 == 0)) {
        (*this_00->_vptr_Fl_Widget[5])();
        pFVar1 = this_00;
      }
    }
    else {
      (*this_00->_vptr_Fl_Widget[6])();
      pFVar1 = (Fl_Widget *)a;
    }
  }
  return (Fl_Widget *)a;
}

Assistant:

Fl_Widget* Fl_Tabs::value() {
  Fl_Widget* v = 0;
  Fl_Widget*const* a = array();
  for (int i=children(); i--;) {
    Fl_Widget* o = *a++;
    if (v) o->hide();
    else if (o->visible()) v = o;
    else if (!i) {o->show(); v = o;}
  }
  return v;
}